

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::ProcessOrEnqueue
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,S2CellId id,S2ShapeIndexCell *index_cell)

{
  uint uVar1;
  Options *this_00;
  S2MinDistance _distance;
  QueueEntry local_d8;
  double local_c0;
  S2MinDistance local_b8;
  S1ChordAngle local_b0;
  undefined4 local_a8;
  S1ChordAngle local_98;
  S2MinDistance distance;
  undefined1 local_88 [8];
  S2Cell cell;
  QueueEntry local_40;
  int local_24;
  S2ShapeIndexCell *pSStack_20;
  int num_edges;
  S2ShapeIndexCell *index_cell_local;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  S2CellId id_local;
  
  pSStack_20 = index_cell;
  index_cell_local = (S2ShapeIndexCell *)this;
  this_local = (S2ClosestEdgeQueryBase<S2MinDistance> *)id.id_;
  if (index_cell != (S2ShapeIndexCell *)0x0) {
    local_24 = CountEdges(index_cell);
    if (local_24 == 0) {
      return;
    }
    if (local_24 < 10) {
      _distance = S2MinDistance::Zero();
      cell.uv_.bounds_[1].bounds_.c_[1] = (VType)this_local;
      QueueEntry::QueueEntry(&local_40,_distance,(S2CellId)this_local,pSStack_20);
      ProcessEdges(this,&local_40);
      return;
    }
  }
  distance.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)this_local;
  S2Cell::S2Cell((S2Cell *)local_88,(S2CellId)this_local);
  local_98.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
  uVar1 = (*this->target_->_vptr_S2DistanceTarget[5])(this->target_,(S2Cell *)local_88,&local_98);
  if ((uVar1 & 1) == 0) {
    local_a8 = 1;
  }
  else {
    if ((this->use_conservative_cell_distance_ & 1U) != 0) {
      local_b8.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)local_98.length2_;
      this_00 = options(this);
      local_c0 = (double)Options::max_error(this_00);
      local_b0.length2_ = (double)::operator-(local_b8,(S1ChordAngle)local_c0);
      local_98.length2_ = local_b0.length2_;
    }
    QueueEntry::QueueEntry
              (&local_d8,(S2MinDistance)local_98.length2_,(S2CellId)this_local,pSStack_20);
    std::
    priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
    ::push(&this->queue_,&local_d8);
    local_a8 = 0;
  }
  S2Cell::~S2Cell((S2Cell *)local_88);
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::ProcessOrEnqueue(
    S2CellId id, const S2ShapeIndexCell* index_cell) {
  if (index_cell) {
    // If this index cell has only a few edges, then it is faster to check
    // them directly rather than computing the minimum distance to the S2Cell
    // and inserting it into the queue.
    static const int kMinEdgesToEnqueue = 10;
    int num_edges = CountEdges(index_cell);
    if (num_edges == 0) return;
    if (num_edges < kMinEdgesToEnqueue) {
      // Set "distance" to zero to avoid the expense of computing it.
      ProcessEdges(QueueEntry(Distance::Zero(), id, index_cell));
      return;
    }
  }
  // Otherwise compute the minimum distance to any point in the cell and add
  // it to the priority queue.
  S2Cell cell(id);
  Distance distance = distance_limit_;
  if (!target_->UpdateMinDistance(cell, &distance)) return;
  if (use_conservative_cell_distance_) {
    // Ensure that "distance" is a lower bound on the true distance to the cell.
    distance = distance - options().max_error();  // operator-=() not defined.
  }
  queue_.push(QueueEntry(distance, id, index_cell));
}